

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall wasm::RemoveNonJSOpsPass::visitStore(RemoveNonJSOpsPass *this,Store *curr)

{
  BasicType BVar1;
  address64_t aVar2;
  pointer pBVar3;
  Unary *pUVar4;
  Type local_28;
  Type local_20;
  Store *local_18;
  Store *curr_local;
  RemoveNonJSOpsPass *this_local;
  
  local_18 = curr;
  curr_local = (Store *)this;
  aVar2 = wasm::Address::operator_cast_to_unsigned_long(&curr->align);
  if ((aVar2 != 0) &&
     (aVar2 = wasm::Address::operator_cast_to_unsigned_long(&local_18->align),
     aVar2 < local_18->bytes)) {
    BVar1 = wasm::Type::getBasic(&local_18->valueType);
    if (BVar1 == f32) {
      wasm::Type::Type(&local_20,i32);
      (local_18->valueType).id = local_20.id;
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      pUVar4 = Builder::makeUnary(pBVar3,ReinterpretFloat32,local_18->value);
      local_18->value = (Expression *)pUVar4;
    }
    else if (BVar1 == f64) {
      wasm::Type::Type(&local_28,i64);
      (local_18->valueType).id = local_28.id;
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      pUVar4 = Builder::makeUnary(pBVar3,ReinterpretFloat64,local_18->value);
      local_18->value = (Expression *)pUVar4;
    }
  }
  return;
}

Assistant:

void visitStore(Store* curr) {
    if (curr->align == 0 || curr->align >= curr->bytes) {
      return;
    }

    // Switch unaligned stores of floats to unaligned stores of integers (which
    // we can actually implement) and then use reinterpretation to store the
    // right value.
    switch (curr->valueType.getBasic()) {
      case Type::f32:
        curr->valueType = Type::i32;
        curr->value = builder->makeUnary(ReinterpretFloat32, curr->value);
        break;
      case Type::f64:
        curr->valueType = Type::i64;
        curr->value = builder->makeUnary(ReinterpretFloat64, curr->value);
        break;
      default:
        break;
    }
  }